

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_widget::base_widget(base_widget *this)

{
  (this->super_base_form)._vptr_base_form = (_func_int **)&PTR_render_002b48a0;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  (this->id_)._M_string_length = 0;
  (this->id_).field_2._M_local_buf[0] = '\0';
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::basic_message(&this->message_);
  booster::locale::basic_message<char>::basic_message(&this->error_message_);
  booster::locale::basic_message<char>::basic_message(&this->help_);
  (this->attr_)._M_dataplus._M_p = (pointer)&(this->attr_).field_2;
  (this->attr_)._M_string_length = 0;
  (this->attr_).field_2._M_local_buf[0] = '\0';
  this->parent_ = (form *)0x0;
  this->field_0x1f0 = 1;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

base_widget::base_widget() : 
	parent_(0),
	is_valid_(1),
	is_set_(0),
	is_disabled_(0),
	is_readonly_(0),
	is_generation_done_(0),
	has_message_(0),
	has_error_(0),
	has_help_(0)
{
}